

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
          *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *in_RSI;
  GTestLog *in_RDI;
  bool dummy [2];
  bool same;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *typed_other;
  GTestLog *in_stack_ffffffffffffff70;
  undefined1 *puVar5;
  bool local_81;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar6;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *in_stack_ffffffffffffff90;
  ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
  *in_stack_ffffffffffffffa0;
  undefined1 local_3a;
  bool local_39;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *local_38;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  GTestLogSeverity severity;
  bool local_1;
  
  lVar2 = (**(code **)(*(long *)in_RDI + 0x10))();
  lVar3 = (**(code **)(*in_RSI + 0x10))();
  severity = (GTestLogSeverity)((ulong)in_RSI >> 0x20);
  bVar1 = IsTrue(lVar2 == lVar3);
  if (!bVar1) {
    in_stack_ffffffffffffffa0 =
         (ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
          *)&stack0xffffffffffffffe4;
    GTestLog::GTestLog(in_RDI,severity,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    poVar4 = GTestLog::GetStream((GTestLog *)in_stack_ffffffffffffffa0);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    in_stack_ffffffffffffff90 =
         (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)
         std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffff70);
  }
  local_38 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>>const>
                       (in_stack_ffffffffffffffa0);
  bVar1 = AtEnd(in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = AtEnd(in_stack_ffffffffffffff90), bVar1)) {
    local_1 = true;
  }
  else {
    local_39 = true;
    uVar6 = 0;
    std::
    get<0ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
              ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                *)0x9d431c);
    std::
    get<0ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
              ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                *)0x9d432f);
    uVar6 = ParamIterator<unsigned_char>::operator==
                      ((ParamIterator<unsigned_char> *)in_stack_ffffffffffffff90,
                       (ParamIterator<unsigned_char> *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
    puVar5 = &local_3a;
    local_81 = false;
    if ((bool)uVar6) {
      local_39 = (bool)uVar6;
      std::
      get<1ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
                ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                  *)0x9d437c);
      std::
      get<1ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
                ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                  *)0x9d438e);
      local_81 = ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::operator==
                           ((ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)
                            in_stack_ffffffffffffff90,
                            (ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)
                            CONCAT17(uVar6,in_stack_ffffffffffffff88));
    }
    local_39 = local_81;
    *puVar5 = local_81;
    local_1 = (bool)(local_39 & 1);
  }
  return local_1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }